

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_DropPhasing_Test::TestBody(BarrierTest_DropPhasing_Test *this)

{
  pointer ptVar1;
  pointer __last;
  size_type __n;
  pointer __result;
  thread *ptVar2;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_00;
  anon_class_32_3_c61425db_for__M_head_impl *__args;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_01;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_02;
  anon_class_32_3_c61425db_for__M_head_impl *__args_00;
  thread *t;
  long lVar3;
  pointer ptVar4;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  vector<std::thread,_std::allocator<std::thread>_> thds;
  atomic<int> step;
  thread local_130;
  barrier<yamc::detail::default_barrier_completion> *local_128;
  long local_120;
  barrier *local_118;
  barrier gate;
  barrier<yamc::detail::default_barrier_completion> barrier;
  
  step.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&barrier,3);
  yamc::test::barrier::barrier(&gate,4);
  thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  __args_00 = extraout_RDX;
  while( true ) {
    ptVar1 = thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (lVar3 == 3) break;
    local_118 = &gate;
    local_130._M_id._M_thread = (id)(id)&step;
    local_128 = &barrier;
    local_120 = lVar3;
    if (thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&thds,1,"vector::_M_realloc_insert");
      __last = thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar4 = thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>,__n)
      ;
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,yamc::test::task_runner<BarrierTest_DropPhasing_Test::TestBody()::__0>(unsigned_long,BarrierTest_DropPhasing_Test::TestBody()::__0)::_lambda()_1_>
                ((allocator_type *)(((long)ptVar1 - (long)ptVar4) + (long)__result),&local_130,
                 __args);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar4,ptVar1,__result,(allocator<std::thread> *)&thds);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar1,__last,ptVar2 + 1,(allocator<std::thread> *)&thds);
      __args_00 = extraout_RDX_01;
      if (ptVar4 != (pointer)0x0) {
        operator_delete(ptVar4);
        __args_00 = extraout_RDX_02;
      }
      thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + __n;
      thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,yamc::test::task_runner<BarrierTest_DropPhasing_Test::TestBody()::__0>(unsigned_long,BarrierTest_DropPhasing_Test::TestBody()::__0)::_lambda()_1_>
                ((allocator_type *)
                 thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_130,__args_00);
      ptVar2 = thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
      __args_00 = extraout_RDX_00;
    }
    lVar3 = lVar3 + 1;
    thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar2;
  }
  yamc::test::barrier::await(&gate);
  ptVar1 = thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = thds.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&thds);
  std::condition_variable::~condition_variable(&gate.cv_);
  std::condition_variable::~condition_variable(&barrier.cv_);
  return;
}

Assistant:

TEST(BarrierTest, DropPhasing)
{
  SETUP_STEPTEST;
  yamc::barrier<> barrier{3};
  yamc::test::task_runner(
    3,
    [&](std::size_t id) {
      switch (id) {
      case 0:
        EXPECT_STEP(1);
        EXPECT_NO_THROW(barrier.arrive_and_drop());
        EXPECT_STEP_RANGE(2, 3);
        break;
      case 1:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(2, 3);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_drop());
        EXPECT_STEP_RANGE(5, 6);
        break;
      case 2:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP(4);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(5, 6);
        break;
      }
    }
  );
}